

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

int __thiscall QProcess::open(QProcess *this,char *__file,int __oflag,...)

{
  QProcessPrivate *this_00;
  int iVar1;
  undefined8 unaff_RBX;
  char *msg;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((this_00->program).d.size != 0) {
      QProcessPrivate::start
                (this_00,(QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(__file,0));
      iVar1 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
      goto LAB_003cdc4f;
    }
    msg = "QProcess::start: program not set";
  }
  else {
    msg = "QProcess::start: Process is already running";
  }
  local_30.context.category = "default";
  local_30.context.function._4_4_ = 0;
  local_30.context._12_8_ = 0;
  local_30.context._4_8_ = 0;
  local_30.context.version = 2;
  iVar1 = 0;
  QMessageLogger::warning(&local_30,msg);
LAB_003cdc4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcess::open(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return false;
    }
    if (d->program.isEmpty()) {
        qWarning("QProcess::start: program not set");
        return false;
    }

    d->start(mode);
    return true;
}